

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::CheckDamageBinID(ValidateVulnerability *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *__format;
  Validate *pVVar5;
  
  uVar2 = (this->v_).damage_bin_id;
  uVar3 = this->prevDamageBinID_;
  if (uVar2 - 1 == uVar3) {
    return;
  }
  uVar4 = (this->super_Validate).lineno_;
  if (uVar3 == 0) {
    __format = 
    "ERROR: First damage bin ID (damage bin ID = %d) on line %d is not 1 for vulnerability ID %d and intensity bin ID %d:\n%s\n"
    ;
    uVar1 = uVar4;
    uVar3 = uVar2;
    uVar2 = (this->v_).vulnerability_id;
    uVar4 = (this->v_).intensity_bin_id;
    pVVar5 = &this->super_Validate;
  }
  else {
    uVar1 = uVar4 - 1;
    pVVar5 = (Validate *)this->prevLine_;
    __format = "ERROR: Non-contiguous damage bin IDs %d on line %d and %d on line %d:\n%s\n%s\n";
  }
  fprintf(_stderr,__format,(ulong)uVar3,(ulong)uVar1,(ulong)uVar2,(ulong)uVar4,pVVar5);
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

inline void ValidateVulnerability::CheckDamageBinID() {

  if ((v_.damage_bin_id - 1) != prevDamageBinID_) {

    if (prevDamageBinID_ == 0) {
      fprintf(stderr, "ERROR: First damage bin ID (damage bin ID = %d) on"
		      " line %d is not 1 for vulnerability ID %d and"
		      " intensity bin ID %d:\n%s\n",
	      v_.damage_bin_id, lineno_, v_.vulnerability_id,
	      v_.intensity_bin_id, line_);
    } else {
      fprintf(stderr, "ERROR: Non-contiguous damage bin IDs %d on line %d"
		      " and %d on line %d:\n%s\n%s\n",
	      prevDamageBinID_, lineno_ - 1, v_.damage_bin_id, lineno_,
	      prevLine_, line_);
    }

    PrintErrorMessage();

  }

}